

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::runInternal(Session *this)

{
  bool bVar1;
  uint uVar2;
  unsigned_long *puVar3;
  element_type *peVar4;
  int *piVar5;
  long in_RDI;
  exception *ex;
  Totals totals;
  TestGroup tests;
  Option<unsigned_long> listed;
  TestGroup *in_stack_fffffffffffffcf0;
  Session *in_stack_fffffffffffffd00;
  int local_2bc;
  int local_2b8 [4];
  int local_2a8;
  IConfig *in_stack_fffffffffffffda0;
  shared_ptr<Catch::Config> *in_stack_fffffffffffffda8;
  shared_ptr<Catch::Config> *in_stack_fffffffffffffe08;
  TestGroup *in_stack_fffffffffffffe10;
  int local_34;
  Option<unsigned_long> local_30 [2];
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x188) & 1) == 0) {
    if (((*(byte *)(in_RDI + 0x6f) & 1) == 0) && ((*(byte *)(in_RDI + 0x72) & 1) == 0)) {
      config(in_stack_fffffffffffffd00);
      clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                in_stack_fffffffffffffcf0);
      seedRng((IConfig *)in_stack_fffffffffffffcf0);
      if ((*(byte *)(in_RDI + 0x71) & 1) != 0) {
        clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  in_stack_fffffffffffffcf0);
        anon_unknown_1::applyFilenamesAsTags(in_stack_fffffffffffffda0);
      }
      list(in_stack_fffffffffffffda8);
      bVar1 = Option::operator_cast_to_bool((Option<unsigned_long> *)0x287ebb);
      if (bVar1) {
        puVar3 = Option<unsigned_long>::operator*(local_30);
        local_34 = (int)*puVar3;
        piVar5 = clara::std::min<int>(&(anonymous_namespace)::MaxExitCode,&local_34);
        local_4 = *piVar5;
      }
      Option<unsigned_long>::~Option((Option<unsigned_long> *)0x287f61);
      if (!bVar1) {
        anon_unknown_1::TestGroup::TestGroup(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        anon_unknown_1::TestGroup::execute(in_stack_fffffffffffffe10);
        peVar4 = clara::std::
                 __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x287fb3);
        uVar2 = (*(peVar4->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
        if (((uVar2 & 1) == 0) || (local_2b8[0] != -1)) {
          local_2bc = local_2a8;
          piVar5 = clara::std::max<int>(local_2b8,&local_2bc);
          in_stack_fffffffffffffcf0 =
               (TestGroup *)clara::std::min<int>(&(anonymous_namespace)::MaxExitCode,piVar5);
          local_4 = *(int *)&(in_stack_fffffffffffffcf0->m_config).
                             super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        else {
          local_4 = 2;
        }
        anon_unknown_1::TestGroup::~TestGroup(in_stack_fffffffffffffcf0);
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return (std::min) (MaxExitCode, static_cast<int>(*listed));

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }